

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

WasmType * __thiscall
Memory::AllocateArray<Memory::Recycler,Wasm::WasmTypes::WasmType,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  WasmType *pWVar1;
  
  if (count != 0) {
    pWVar1 = (WasmType *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3e != 0) | count << 2,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    return pWVar1;
  }
  Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
  return (WasmType *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}